

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileDefinitionsCommand.h
# Opt level: O2

cmCommand * __thiscall
cmTargetCompileDefinitionsCommand::Clone(cmTargetCompileDefinitionsCommand *this)

{
  cmCommand *this_00;
  
  this_00 = (cmCommand *)operator_new(0x78);
  cmTargetCompileDefinitionsCommand((cmTargetCompileDefinitionsCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmTargetCompileDefinitionsCommand;
    }